

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::buildSelect(TranslateToFuzzReader *this,ThreeArgs *args)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  pEVar1 = args->a;
  pEVar2 = args->b;
  pEVar3 = args->c;
  pEVar4 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8)
  ;
  pEVar4->_id = SelectId;
  (pEVar4->type).id = 0;
  *(Expression **)(pEVar4 + 2) = pEVar1;
  *(Expression **)(pEVar4 + 1) = pEVar2;
  pEVar4[1].type.id = (uintptr_t)pEVar3;
  wasm::Select::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::buildSelect(const ThreeArgs& args) {
  return builder.makeSelect(args.a, args.b, args.c);
}